

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int ncnn::get_big_cpu_count(void)

{
  int iVar1;
  CpuSet *this;
  
  this = get_cpu_thread_affinity_mask(2);
  iVar1 = CpuSet::num_enabled(this);
  if (iVar1 == 0) {
    iVar1 = g_cpucount;
  }
  return iVar1;
}

Assistant:

int get_big_cpu_count()
{
    int big_cpu_count = get_cpu_thread_affinity_mask(2).num_enabled();
    return big_cpu_count ? big_cpu_count : g_cpucount;
}